

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_AES.cpp
# Opt level: O0

void __thiscall ASDCP::HMACContext::h__HMACContext::Finalize(h__HMACContext *this)

{
  uint local_bc;
  undefined8 uStack_b8;
  ui32_t i;
  byte_t xor_buf [64];
  undefined1 local_70 [8];
  SHA_CTX SHA;
  h__HMACContext *this_local;
  
  SHA._88_8_ = this;
  SHA1_Init((SHA_CTX *)local_70);
  memset(&stack0xffffffffffffff48,0,0x40);
  uStack_b8 = *(undefined8 *)this->m_key;
  xor_buf._0_8_ = *(undefined8 *)(this->m_key + 8);
  SHA1_Init((SHA_CTX *)local_70);
  for (local_bc = 0; local_bc < 0x40; local_bc = local_bc + 1) {
    xor_buf[(ulong)local_bc - 8] = xor_buf[(ulong)local_bc - 8] ^ 0x5c;
  }
  SHA1_Update((SHA_CTX *)local_70,&stack0xffffffffffffff48,0x40);
  SHA1_Final(this->m_SHAValue,(SHA_CTX *)this);
  SHA1_Update((SHA_CTX *)local_70,this->m_SHAValue,0x14);
  SHA1_Final(this->m_SHAValue,(SHA_CTX *)local_70);
  this->m_Final = true;
  return;
}

Assistant:

void
  Finalize()
  {
    SHA_CTX SHA;
    SHA1_Init(&SHA);

    byte_t xor_buf[B_len];
    memset(xor_buf, 0, B_len);
    memcpy(xor_buf, m_key, KeyLen);

    SHA1_Init(&SHA);

    // H(K XOR opad, H(K XOR ipad, text))
    //   ^^^^^^^^^^
    for ( ui32_t i = 0; i < B_len; i++ )
      xor_buf[i] ^= opad_const;

    SHA1_Update(&SHA, xor_buf, B_len);

    // H(K XOR opad, H(K XOR ipad, text))
    //               ^
    SHA1_Final(m_SHAValue, &m_SHA);
    SHA1_Update(&SHA, m_SHAValue, HMAC_SIZE);

    // H(K XOR opad, H(K XOR ipad, text))
    // ^
    SHA1_Final(m_SHAValue, &SHA);
    m_Final = true;
  }